

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void gt_tval_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,int timeridx,uint64_t value)

{
  uint uVar1;
  uint64_t uVar2;
  int64_t iVar3;
  CPUARMState_conflict *__mptr;
  
  if (((int)ri == 4) || ((int)ri == 1)) {
    uVar2 = gt_virt_cnt_offset(env);
  }
  else {
    uVar2 = 0;
  }
  iVar3 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar1 = gt_cntfrq_period_ns_aarch64((ARMCPU_conflict *)(env[-4].vfp.zregs[0x17].d + 0x14));
  (env->cp15).c14_timer[(ulong)ri & 0xffffffff].cval =
       ((long)timeridx - uVar2) + iVar3 / (long)(ulong)uVar1;
  return;
}

Assistant:

static void gt_tval_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          int timeridx,
                          uint64_t value)
{
    uint64_t offset = 0;

    switch (timeridx) {
    case GTIMER_VIRT:
    case GTIMER_HYPVIRT:
        offset = gt_virt_cnt_offset(env);
        break;
    }

    env->cp15.c14_timer[timeridx].cval = gt_get_countervalue(env) - offset +
                                         sextract64(value, 0, 32);
    gt_recalc_timer(env_archcpu(env), timeridx);
}